

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::ScriptFunction::ScriptFunction
          (ScriptFunction *this,FunctionProxy *proxy,ScriptFunctionType *type)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ScriptFunctionType *pSVar5;
  FunctionBody *this_00;
  FunctionEntryPointInfo *this_01;
  ScriptContext *pSVar6;
  
  ScriptFunctionBase::ScriptFunctionBase
            (&this->super_ScriptFunctionBase,&type->super_DynamicType,(proxy->functionInfo).ptr);
  (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013d2098;
  Memory::WriteBarrierPtr<Js::FrameDisplay>::WriteBarrierSet
            (&this->environment,(FrameDisplay *)&NullFrameDisplay);
  (this->cachedScopeObj).ptr = (ActivationObjectEx *)0x0;
  this->hasInlineCaches = false;
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x22,"(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy)",
                                "proxy->GetFunctionInfo()->GetFunctionProxy() == proxy");
    if (!bVar2) goto LAB_00be71bc;
    *puVar4 = 0;
  }
  pSVar5 = FunctionProxy::GetDeferredPrototypeType(proxy);
  if (pSVar5 != type) {
    pSVar5 = FunctionProxy::GetUndeferredFunctionType(proxy);
    if (pSVar5 != type) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x23,
                                  "(proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type)"
                                  ,
                                  "proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type"
                                 );
      if (!bVar2) {
LAB_00be71bc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  bVar2 = FunctionProxy::IsDeferred(proxy);
  if (!bVar2) {
    this_00 = FunctionProxy::GetFunctionBody(proxy);
    if ((this_00->field_0x178 & 2) == 0) {
      this_01 = FunctionBody::GetDefaultFunctionEntryPointInfo(this_00);
      bVar2 = EntryPointInfo::IsCodeGenDone(&this_01->super_EntryPointInfo);
      if (bVar2) {
        uVar3 = FunctionBody::GetByteCodeCount(this_00);
        pSVar6 = Js::Type::GetScriptContext((Type *)type);
        pSVar6->jitCodeUsed = pSVar6->jitCodeUsed + uVar3;
        pSVar6 = Js::Type::GetScriptContext((Type *)type);
        pSVar6->funcJitCodeUsed = pSVar6->funcJitCodeUsed + 1;
        this_00->field_0x178 = this_00->field_0x178 | 2;
      }
    }
  }
  return;
}

Assistant:

ScriptFunction::ScriptFunction(FunctionProxy * proxy, ScriptFunctionType* type)
        : ScriptFunctionBase(type, proxy->GetFunctionInfo()),
        environment((FrameDisplay*)&NullFrameDisplay), cachedScopeObj(nullptr),
        hasInlineCaches(false)
    {
        Assert(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy);
        Assert(proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type);
        DebugOnly(VerifyEntryPoint());

#if ENABLE_NATIVE_CODEGEN
        if (!proxy->IsDeferred())
        {
            FunctionBody* body = proxy->GetFunctionBody();
            if(!body->GetNativeEntryPointUsed() &&
                body->GetDefaultFunctionEntryPointInfo()->IsCodeGenDone())
            {
                MemoryBarrier();
#ifdef BGJIT_STATS
                type->GetScriptContext()->jitCodeUsed += body->GetByteCodeCount();
                type->GetScriptContext()->funcJitCodeUsed++;
#endif
                body->SetNativeEntryPointUsed(true);
            }
        }
#endif
    }